

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

UINT8 __thiscall DROPlayer::SeekToTick(DROPlayer *this,UINT32 tick)

{
  UINT32 UVar1;
  UINT32 tick_local;
  DROPlayer *this_local;
  
  this->_playState = this->_playState | 8;
  if (this->_playTick < tick) {
    ParseFile(this,tick - this->_playTick);
  }
  UVar1 = (*(this->super_PlayerBase)._vptr_PlayerBase[0x15])(this,(ulong)this->_playTick);
  this->_playSmpl = UVar1;
  this->_playState = this->_playState & 0xf7;
  return '\0';
}

Assistant:

UINT8 DROPlayer::SeekToTick(UINT32 tick)
{
	_playState |= PLAYSTATE_SEEK;
	if (tick > _playTick)
		ParseFile(tick - _playTick);
	_playSmpl = Tick2Sample(_playTick);
	_playState &= ~PLAYSTATE_SEEK;
	return 0x00;
}